

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

int nn_global_create_ep(nn_sock *sock,char *addr,int bind)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_list_item *it;
  nn_list_item *pnVar4;
  nn_transport *transport;
  
  if (addr != (char *)0x0) {
    sVar2 = strlen(addr);
    if (0x7f < sVar2) {
      return -0x24;
    }
    pcVar3 = strchr(addr,0x3a);
    if ((pcVar3 != (char *)0x0) && (pcVar3[1] == '/')) {
      if (pcVar3[2] != '/') {
        return -0x16;
      }
      it = nn_list_begin(&self.transports);
      pnVar4 = nn_list_end(&self.transports);
      if (it != pnVar4) {
        do {
          transport = (nn_transport *)&it[-4].prev;
          if (it == (nn_list_item *)0x0) {
            transport = (nn_transport *)0x0;
          }
          pnVar4 = (nn_list_item *)transport->name;
          sVar2 = strlen((char *)pnVar4);
          if ((sVar2 == (long)pcVar3 - (long)addr) &&
             (iVar1 = bcmp(pnVar4,addr,(long)pcVar3 - (long)addr), iVar1 == 0)) goto LAB_0011fd1e;
          it = nn_list_next(&self.transports,it);
          pnVar4 = nn_list_end(&self.transports);
        } while (it != pnVar4);
      }
      transport = (nn_transport *)0x0;
LAB_0011fd1e:
      if (transport == (nn_transport *)0x0) {
        return -0x5d;
      }
      iVar1 = nn_sock_add_ep(sock,transport,bind,pcVar3 + 3);
      return iVar1;
    }
  }
  return -0x16;
}

Assistant:

static int nn_global_create_ep (struct nn_sock *sock, const char *addr,
    int bind)
{
    int rc;
    const char *proto;
    const char *delim;
    size_t protosz;
    struct nn_transport *tp;
    struct nn_list_item *it;

    /*  Check whether address is valid. */
    if (!addr)
        return -EINVAL;
    if (strlen (addr) >= NN_SOCKADDR_MAX)
        return -ENAMETOOLONG;

    /*  Separate the protocol and the actual address. */
    proto = addr;
    delim = strchr (addr, ':');
    if (!delim)
        return -EINVAL;
    if (delim [1] != '/' || delim [2] != '/')
        return -EINVAL;
    protosz = delim - addr;
    addr += protosz + 3;

    /*  Find the specified protocol. */
    tp = NULL;
    for (it = nn_list_begin (&self.transports);
          it != nn_list_end (&self.transports);
          it = nn_list_next (&self.transports, it)) {
        tp = nn_cont (it, struct nn_transport, item);
        if (strlen (tp->name) == protosz &&
              memcmp (tp->name, proto, protosz) == 0)
            break;
        tp = NULL;
    }

    /*  The protocol specified doesn't match any known protocol. */
    if (!tp) {
        return -EPROTONOSUPPORT;
    }

    /*  Ask the socket to create the endpoint. */
    rc = nn_sock_add_ep (sock, tp, bind, addr);
    return rc;
}